

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O3

ssize_t archive_write_gnutar_data(archive_write *a,void *buff,size_t s)

{
  ulong *puVar1;
  int iVar2;
  size_t sVar3;
  ulong length;
  
  puVar1 = (ulong *)a->format_data;
  length = *puVar1;
  if (s <= *puVar1) {
    length = s;
  }
  iVar2 = __archive_write_output(a,buff,length);
  *puVar1 = *puVar1 - length;
  sVar3 = (long)iVar2;
  if (iVar2 == 0) {
    sVar3 = length;
  }
  return sVar3;
}

Assistant:

static ssize_t
archive_write_gnutar_data(struct archive_write *a, const void *buff, size_t s)
{
	struct gnutar *gnutar;
	int ret;

	gnutar = (struct gnutar *)a->format_data;
	if (s > gnutar->entry_bytes_remaining)
		s = (size_t)gnutar->entry_bytes_remaining;
	ret = __archive_write_output(a, buff, s);
	gnutar->entry_bytes_remaining -= s;
	if (ret != ARCHIVE_OK)
		return (ret);
	return (s);
}